

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_init_randoms(void)

{
  double seed;
  double temp;
  double m;
  double a;
  int ii;
  double local_28;
  int local_8;
  int local_4;
  
  if (fits_rand_value == (float *)0x0) {
    fits_rand_value = (float *)calloc(10000,4);
    if (fits_rand_value == (float *)0x0) {
      local_4 = 0x71;
    }
    else {
      local_28 = 1.0;
      for (local_8 = 0; local_8 < 10000; local_8 = local_8 + 1) {
        local_28 = (double)(int)((local_28 * 16807.0) / 2147483647.0) * -2147483647.0 +
                   local_28 * 16807.0;
        fits_rand_value[local_8] = (float)(local_28 / 2147483647.0);
      }
      if ((int)local_28 == 0x3e345911) {
        local_4 = 0;
      }
      else {
        ffpmsg((char *)0x1ded24);
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int fits_init_randoms(void) {

/* initialize an array of random numbers */

    int ii;
    double a = 16807.0;
    double m = 2147483647.0;
    double temp, seed;

    FFLOCK;
 
    if (fits_rand_value) {
       FFUNLOCK;
       return(0);  /* array is already initialized */
    }

    /* allocate array for the random number sequence */
    /* THIS MEMORY IS NEVER FREED */
    fits_rand_value = calloc(N_RANDOM, sizeof(float));

    if (!fits_rand_value) {
        FFUNLOCK;
	return(MEMORY_ALLOCATION);
    }
		       
    /*  We need a portable algorithm that anyone can use to generate this
        exact same sequence of random number.  The C 'rand' function is not
	suitable because it is not available to Fortran or Java programmers.
	Instead, use a well known simple algorithm published here: 
	"Random number generators: good ones are hard to find", Communications of the ACM,
        Volume 31 ,  Issue 10  (October 1988) Pages: 1192 - 1201 
    */  

    /* initialize the random numbers */
    seed = 1;
    for (ii = 0; ii < N_RANDOM; ii++) {
        temp = a * seed;
	seed = temp -m * ((int) (temp / m) );
	fits_rand_value[ii] = (float) (seed / m);
    }

    FFUNLOCK;

    /* 
    IMPORTANT NOTE: the 10000th seed value must have the value 1043618065 if the 
       algorithm has been implemented correctly */
    
    if ( (int) seed != 1043618065) {
        ffpmsg("fits_init_randoms generated incorrect random number sequence");
	return(1);
    } else {
        return(0);
    }
}